

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O3

buffer_ptr<duckdb::Vector> __thiscall
duckdb::make_buffer<duckdb::Vector,duckdb::LogicalType&,unsigned_int&>
          (duckdb *this,LogicalType *args,uint *args_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  buffer_ptr<duckdb::Vector> bVar2;
  undefined1 local_21;
  Vector *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_20 = (Vector *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::Vector,std::allocator<duckdb::Vector>,duckdb::LogicalType&,unsigned_int&>
            (&local_18,&local_20,(allocator<duckdb::Vector> *)&local_21,args,args_1);
  *(Vector **)this = local_20;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_18._M_pi;
  _Var1._M_pi = extraout_RDX;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_18._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00c5cb9a;
    }
    else {
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
LAB_00c5cb9a:
  bVar2.internal.super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  bVar2.internal.super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (buffer_ptr<duckdb::Vector>)
         bVar2.internal.super___shared_ptr<duckdb::Vector,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

buffer_ptr<T> make_buffer(ARGS &&...args) { // NOLINT: mimic std casing
	return make_shared_ptr<T>(std::forward<ARGS>(args)...);
}